

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page-queue.c
# Opt level: O3

mi_page_queue_t * mi_heap_page_queue_of(mi_heap_t *heap,mi_page_t *page)

{
  ulong uVar1;
  ulong uVar2;
  
  if (((page->flags).full_aligned & 1) == 0) {
    uVar1 = 0x49;
    if ((page->field_0x8 & 4) == 0) {
      uVar2 = page->block_size + 7;
      if (uVar2 < 0x48) {
        uVar1 = 1;
        if (0xf < uVar2) {
          uVar1 = (ulong)((int)(uVar2 >> 3) + 1U & 0x1e);
        }
      }
      else if (uVar2 < 0x10008) {
        uVar2 = (uVar2 >> 3) - 1;
        uVar1 = 0x3f;
        if (uVar2 != 0) {
          for (; uVar2 >> uVar1 == 0; uVar1 = uVar1 - 1) {
          }
        }
        uVar1 = ((ulong)((uint)(uVar2 >> (0x3dU - (char)(uVar1 ^ 0x3f) & 0x3f)) & 3) +
                 ((uVar1 ^ 0x3f) & 0xffffffff) * 4 ^ 0xfc) - 3;
      }
    }
  }
  else {
    uVar1 = 0x4a;
  }
  return heap->pages + uVar1;
}

Assistant:

static mi_page_queue_t* mi_heap_page_queue_of(mi_heap_t* heap, const mi_page_t* page) {
  mi_assert_internal(heap!=NULL);
  const size_t bin = mi_page_bin(page);
  mi_page_queue_t* pq = &heap->pages[bin];
  mi_assert_internal((mi_page_block_size(page) == pq->block_size) ||
                       (mi_page_is_large_or_huge(page) && mi_page_queue_is_huge(pq)) ||
                         (mi_page_is_in_full(page) && mi_page_queue_is_full(pq)));
  return pq;
}